

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highs_c_api.cpp
# Opt level: O1

HighsInt Highs_getRowsByMask(void *highs,HighsInt *mask,HighsInt *num_row,double *lower,
                            double *upper,HighsInt *num_nz,HighsInt *matrix_start,
                            HighsInt *matrix_index,double *matrix_value)

{
  HighsStatus HVar1;
  HighsInt local_num_nz;
  HighsInt local_num_row;
  HighsInt local_28;
  HighsInt local_24;
  
  HVar1 = Highs::getRows((Highs *)highs,mask,&local_24,lower,upper,&local_28,matrix_start,
                         matrix_index,matrix_value);
  *num_row = local_24;
  *num_nz = local_28;
  return HVar1;
}

Assistant:

HighsInt Highs_getRowsByMask(const void* highs, const HighsInt* mask,
                             HighsInt* num_row, double* lower, double* upper,
                             HighsInt* num_nz, HighsInt* matrix_start,
                             HighsInt* matrix_index, double* matrix_value) {
  HighsInt local_num_row, local_num_nz;
  HighsStatus status =
      ((Highs*)highs)
          ->getRows(mask, local_num_row, lower, upper, local_num_nz,
                    matrix_start, matrix_index, matrix_value);
  *num_row = local_num_row;
  *num_nz = local_num_nz;
  return (HighsInt)status;
}